

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int apply_denoise_2d(AV1_COMP *cpi,YV12_BUFFER_CONFIG *sd,int block_size,float noise_level,
                    int64_t time_stamp,int64_t end_time)

{
  int iVar1;
  aom_denoise_and_model_t *paVar2;
  aom_film_grain_table_entry_t *paVar3;
  aom_film_grain_t *in_RCX;
  undefined4 in_EDX;
  int64_t in_RSI;
  aom_film_grain_table_t *in_RDI;
  undefined8 in_R8;
  undefined4 in_XMM0_Da;
  AV1_COMMON *cm;
  int in_stack_0000007c;
  aom_film_grain_t *in_stack_00000080;
  YV12_BUFFER_CONFIG *in_stack_00000088;
  aom_denoise_and_model_t *in_stack_00000090;
  aom_film_grain_table_t *t;
  
  t = in_RDI;
  if (in_RDI[0x9d2e].tail == (aom_film_grain_table_entry_t *)0x0) {
    paVar2 = aom_denoise_and_model_alloc
                       ((int)((ulong)in_RCX >> 0x20),(int)in_RCX,(float)((ulong)in_R8 >> 0x20));
    t[0x9d2e].tail = (aom_film_grain_table_entry_t *)paVar2;
    if (t[0x9d2e].tail == (aom_film_grain_table_entry_t *)0x0) {
      aom_set_error((aom_internal_error_info *)in_RDI[0x3bfb].head,AOM_CODEC_MEM_ERROR,
                    "Error allocating denoise and model");
      return -1;
    }
  }
  if (t[0x9d2e].head == (aom_film_grain_table_entry_t *)0x0) {
    paVar3 = (aom_film_grain_table_entry_t *)aom_malloc(0x22f69e);
    t[0x9d2e].head = paVar3;
    if (t[0x9d2e].head == (aom_film_grain_table_entry_t *)0x0) {
      aom_set_error((aom_internal_error_info *)in_RDI[0x3bfb].head,AOM_CODEC_MEM_ERROR,
                    "Error allocating grain table");
      return -1;
    }
    memset(t[0x9d2e].head,0,0x10);
  }
  iVar1 = aom_denoise_and_model_run
                    (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007c);
  if ((iVar1 != 0) && (*(int *)&in_RDI[0x41c4].tail != 0)) {
    aom_film_grain_table_append(t,in_RSI,CONCAT44(in_EDX,in_XMM0_Da),in_RCX);
  }
  return 0;
}

Assistant:

static int apply_denoise_2d(AV1_COMP *cpi, const YV12_BUFFER_CONFIG *sd,
                            int block_size, float noise_level,
                            int64_t time_stamp, int64_t end_time) {
  AV1_COMMON *const cm = &cpi->common;
  if (!cpi->denoise_and_model) {
    cpi->denoise_and_model = aom_denoise_and_model_alloc(
        cm->seq_params->bit_depth, block_size, noise_level);
    if (!cpi->denoise_and_model) {
      aom_set_error(cm->error, AOM_CODEC_MEM_ERROR,
                    "Error allocating denoise and model");
      return -1;
    }
  }
  if (!cpi->film_grain_table) {
    cpi->film_grain_table = aom_malloc(sizeof(*cpi->film_grain_table));
    if (!cpi->film_grain_table) {
      aom_set_error(cm->error, AOM_CODEC_MEM_ERROR,
                    "Error allocating grain table");
      return -1;
    }
    memset(cpi->film_grain_table, 0, sizeof(*cpi->film_grain_table));
  }
  if (aom_denoise_and_model_run(cpi->denoise_and_model, sd,
                                &cm->film_grain_params,
                                cpi->oxcf.enable_dnl_denoising)) {
    if (cm->film_grain_params.apply_grain) {
      aom_film_grain_table_append(cpi->film_grain_table, time_stamp, end_time,
                                  &cm->film_grain_params);
    }
  }
  return 0;
}